

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O3

Ptr __thiscall core::image::blur_gaussian<float>(image *this,ConstPtr *in,float sigma)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  element_type *peVar4;
  pointer pfVar5;
  long lVar6;
  undefined1 auVar7 [8];
  uint uVar8;
  Image<float> *pIVar9;
  invalid_argument *this_00;
  int iVar10;
  int iVar11;
  uint uVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  int iVar15;
  int iVar16;
  int x;
  int iVar17;
  int iVar18;
  ulong uVar19;
  size_type __new_size;
  float fVar20;
  float fVar21;
  Ptr PVar22;
  undefined1 local_c0 [8];
  vector<float,_std::allocator<float>_> kernel;
  Image<float> *local_98;
  Ptr sep;
  Ptr *out;
  int local_34;
  
  peVar4 = (in->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar4 == (element_type *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Null image given");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (ABS(sigma) <= 0.1) {
    pIVar9 = (Image<float> *)operator_new(0x30);
    iVar1 = (peVar4->super_TypedImageBase<float>).super_ImageBase.h;
    (pIVar9->super_TypedImageBase<float>).super_ImageBase.w =
         (peVar4->super_TypedImageBase<float>).super_ImageBase.w;
    (pIVar9->super_TypedImageBase<float>).super_ImageBase.h = iVar1;
    (pIVar9->super_TypedImageBase<float>).super_ImageBase.c =
         (peVar4->super_TypedImageBase<float>).super_ImageBase.c;
    (pIVar9->super_TypedImageBase<float>).super_ImageBase._vptr_ImageBase =
         (_func_int **)&PTR__TypedImageBase_0012fbe8;
    std::vector<float,_std::allocator<float>_>::vector
              (&(pIVar9->super_TypedImageBase<float>).data,
               &(peVar4->super_TypedImageBase<float>).data);
    (pIVar9->super_TypedImageBase<float>).super_ImageBase._vptr_ImageBase =
         (_func_int **)&PTR__TypedImageBase_0012fb60;
    *(Image<float> **)this = pIVar9;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<float>*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),pIVar9);
    _Var14._M_pi = extraout_RDX_02;
  }
  else {
    iVar1 = (peVar4->super_TypedImageBase<float>).super_ImageBase.w;
    iVar2 = (peVar4->super_TypedImageBase<float>).super_ImageBase.h;
    uVar3 = (peVar4->super_TypedImageBase<float>).super_ImageBase.c;
    fVar20 = ceilf(sigma * 2.884);
    iVar15 = (int)fVar20;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_c0,(long)(int)(iVar15 + 1U),
               (allocator_type *)&local_98);
    auVar7 = local_c0;
    if (-1 < iVar15) {
      uVar19 = 0;
      do {
        fVar20 = expf((-(float)(int)uVar19 * (float)(int)uVar19) / ((sigma + sigma) * sigma));
        *(float *)((long)auVar7 + uVar19 * 4) = fVar20;
        uVar19 = uVar19 + 1;
      } while (iVar15 + 1U != uVar19);
    }
    pIVar9 = (Image<float> *)operator_new(0x30);
    (pIVar9->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar9->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pIVar9->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pIVar9->super_TypedImageBase<float>).super_ImageBase._vptr_ImageBase =
         (_func_int **)&PTR__TypedImageBase_0012fb60;
    (pIVar9->super_TypedImageBase<float>).super_ImageBase.w = iVar1;
    (pIVar9->super_TypedImageBase<float>).super_ImageBase.h = iVar2;
    (pIVar9->super_TypedImageBase<float>).super_ImageBase.c = uVar3;
    __new_size = (size_type)(int)(iVar2 * iVar1 * uVar3);
    std::vector<float,_std::allocator<float>_>::resize
              (&(pIVar9->super_TypedImageBase<float>).data,__new_size);
    kernel.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)&PTR__TypedImageBase_0012fb60;
    local_98 = pIVar9;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<float>*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sep,pIVar9);
    if (0 < iVar2) {
      local_34 = 0;
      iVar17 = 0;
      do {
        sep.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = iVar17;
        if (0 < iVar1) {
          iVar17 = 0;
          do {
            if (0 < (int)uVar3) {
              iVar18 = (local_98->super_TypedImageBase<float>).super_ImageBase.c;
              pfVar5 = (local_98->super_TypedImageBase<float>).data.
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar19 = 0;
              do {
                fVar20 = NAN;
                if (-1 < iVar15) {
                  peVar4 = (in->
                           super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr;
                  fVar21 = 0.0;
                  fVar20 = 0.0;
                  iVar16 = iVar15 * 2 + 1;
                  uVar8 = -iVar15;
                  do {
                    iVar11 = iVar17 + uVar8;
                    iVar10 = iVar1 + -1;
                    if (iVar11 < iVar1 + -1) {
                      iVar10 = iVar11;
                    }
                    if (iVar11 < 0) {
                      iVar10 = 0;
                    }
                    uVar12 = -uVar8;
                    if (0 < (int)uVar8) {
                      uVar12 = uVar8;
                    }
                    fVar20 = fVar20 + (peVar4->super_TypedImageBase<float>).data.
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_start
                                      [uVar19 + (long)(iVar10 + sep.
                                                  super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi._4_4_ * iVar1) *
                                                (long)(peVar4->super_TypedImageBase<float>).
                                                      super_ImageBase.c] *
                                      *(float *)((long)local_c0 + (ulong)uVar12 * 4);
                    fVar21 = fVar21 + *(float *)((long)local_c0 + (ulong)uVar12 * 4);
                    uVar8 = uVar8 + 1;
                    iVar16 = iVar16 + -1;
                  } while (iVar16 != 0);
                  fVar20 = fVar20 / fVar21;
                }
                pfVar5[(long)local_34 * (long)iVar18 + uVar19] = fVar20;
                uVar19 = uVar19 + 1;
              } while (uVar19 != uVar3);
            }
            iVar17 = iVar17 + 1;
            local_34 = local_34 + 1;
          } while (iVar17 != iVar1);
        }
        iVar17 = sep.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi._4_4_ + 1;
      } while (sep.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._4_4_ + 1 != iVar2);
    }
    pIVar9 = (Image<float> *)operator_new(0x30);
    (pIVar9->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar9->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pIVar9->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pIVar9->super_TypedImageBase<float>).super_ImageBase._vptr_ImageBase =
         (_func_int **)
         kernel.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    (pIVar9->super_TypedImageBase<float>).super_ImageBase.w = iVar1;
    (pIVar9->super_TypedImageBase<float>).super_ImageBase.h = iVar2;
    (pIVar9->super_TypedImageBase<float>).super_ImageBase.c = uVar3;
    std::vector<float,_std::allocator<float>_>::resize
              (&(pIVar9->super_TypedImageBase<float>).data,__new_size);
    *(Image<float> **)this = pIVar9;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<float>*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),pIVar9);
    _Var14._M_pi = extraout_RDX;
    if (0 < iVar2) {
      iVar17 = 0;
      local_34 = 0;
      do {
        if (0 < iVar1) {
          lVar6 = *(long *)this;
          iVar18 = 0;
          do {
            if (0 < (int)uVar3) {
              p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)local_34 * (long)*(int *)(lVar6 + 0x10) * 4 + *(long *)(lVar6 + 0x18)
                        );
              uVar19 = 0;
              _Var14._M_pi = p_Var13;
              do {
                fVar20 = NAN;
                if (-1 < iVar15) {
                  fVar21 = 0.0;
                  _Var14._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 (ulong)(iVar15 * 2 + 1);
                  fVar20 = 0.0;
                  uVar8 = -iVar15;
                  do {
                    iVar16 = iVar17 + uVar8;
                    iVar10 = iVar2 + -1;
                    if (iVar16 < iVar2 + -1) {
                      iVar10 = iVar16;
                    }
                    if (iVar16 < 0) {
                      iVar10 = 0;
                    }
                    uVar12 = -uVar8;
                    if (0 < (int)uVar8) {
                      uVar12 = uVar8;
                    }
                    fVar20 = fVar20 + (local_98->super_TypedImageBase<float>).data.
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_start
                                      [uVar19 + (long)(iVar10 * iVar1 + iVar18) *
                                                (long)(local_98->super_TypedImageBase<float>).
                                                      super_ImageBase.c] *
                                      *(float *)((long)local_c0 + (ulong)uVar12 * 4);
                    fVar21 = fVar21 + *(float *)((long)local_c0 + (ulong)uVar12 * 4);
                    uVar8 = uVar8 + 1;
                    uVar12 = (int)_Var14._M_pi - 1;
                    _Var14._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar12;
                  } while (uVar12 != 0);
                  fVar20 = fVar20 / fVar21;
                }
                *(float *)((long)&p_Var13->_vptr__Sp_counted_base + uVar19 * 4) = fVar20;
                uVar19 = uVar19 + 1;
              } while (uVar19 != uVar3);
            }
            iVar18 = iVar18 + 1;
            local_34 = local_34 + 1;
          } while (iVar18 != iVar1);
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 != iVar2);
    }
    if (sep.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 sep.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      _Var14._M_pi = extraout_RDX_00;
    }
    if (local_c0 != (undefined1  [8])0x0) {
      operator_delete((void *)local_c0);
      _Var14._M_pi = extraout_RDX_01;
    }
  }
  PVar22.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var14._M_pi;
  PVar22.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar22.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

typename Image<T>::Ptr
blur_gaussian (typename Image<T>::ConstPtr in, float sigma)
{
    if (in == nullptr)
        throw std::invalid_argument("Null image given");

    /* Small sigmas result in literally no change. */
    if (MATH_EPSILON_EQ(sigma, 0.0f, 0.1f))
        return in->duplicate();

    int const w = in->width();
    int const h = in->height();
    int const c = in->channels();
    int const ks = std::ceil(sigma * 2.884f); // Cap kernel at 1/128
    std::vector<float> kernel(ks + 1);

    /* Fill kernel values. */
    for (int i = 0; i < ks + 1; ++i)
        kernel[i] = math::gaussian((float)i, sigma);

#if 1 // Separated kernel implementation

    /* Convolve the image in x direction. */
    typename Image<T>::Ptr sep(Image<T>::create(w, h, c));
    int px = 0;
    for (int y = 0; y < h; ++y)
        for (int x = 0; x < w; ++x, ++px)
            for (int cc = 0; cc < (int)c; ++cc)
            {
                math::Accum<T> accum(T(0));
                for (int i = -ks; i <= ks; ++i)
                {
                    int idx = math::clamp(x + i, 0, (int)w - 1);
                    accum.add(in->at(y * w + idx, cc), kernel[std::abs(i)]);
                }
                sep->at(px, cc) = accum.normalized();
            }

    /* Convolve the image in y direction. */
    typename Image<T>::Ptr out(Image<T>::create(w, h, c));
    px = 0;
    for (int y = 0; y < h; ++y)
        for (int x = 0; x < w; ++x, ++px)
            for (int cc = 0; cc < c; ++cc)
            {
                math::Accum<T> accum(T(0));
                for (int i = -ks; i <= ks; ++i)
                {
                    int idx = math::clamp(y + i, 0, (int)h - 1);
                    accum.add(sep->at(idx * w + x, cc), kernel[std::abs(i)]);
                }
                out->at(px, cc) = accum.normalized();
            }

#else // Non-separated kernel implementation

    typename Image<T>::Ptr out(Image<T>::create(w, h, c));
    int px = 0;
    for (int y = 0; y < h; ++y)
        for (int x = 0; x < w; ++x, ++px)
            for (int cc = 0; cc < c; ++cc)
            {
                math::Accum<T> accum(T(0));

                for (int ky = -ks; ky <= ks; ++ky)
                    for (int kx = -ks; kx <= ks; ++kx)
                    {
                        int idx_x = math::clamp(x + kx, 0, (int)w - 1);
                        int idx_y = math::clamp(y + ky, 0, (int)h - 1);
                        accum.add(in->at(idx_y * w + idx_x, cc),
                            kernel[std::abs(kx)] * kernel[std::abs(ky)]);
                    }

                out->at(px, cc) = accum.normalized();
            }

#endif

    return out;
}